

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movieTickets.cpp
# Opt level: O0

void getInput(string *movieName,double *adultTicketPrice,double *childTicketPrice,
             int *noOfAdultTicketSold,int *noOfChildTicketSold,double *percentageDonation)

{
  double *percentageDonation_local;
  int *noOfChildTicketSold_local;
  int *noOfAdultTicketSold_local;
  double *childTicketPrice_local;
  double *adultTicketPrice_local;
  string *movieName_local;
  
  std::operator<<((ostream *)&std::cout,"Name of the movie: ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)movieName);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Adult ticket price: ");
  std::istream::operator>>((istream *)&std::cin,adultTicketPrice);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Child ticket price: ");
  std::istream::operator>>((istream *)&std::cin,childTicketPrice);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Number of adult tickets sold: ");
  std::istream::operator>>((istream *)&std::cin,noOfAdultTicketSold);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Number of child tickets sold: ");
  std::istream::operator>>((istream *)&std::cin,noOfChildTicketSold);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Gross percentage that you would like to donate: ");
  std::istream::operator>>((istream *)&std::cin,percentageDonation);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void getInput(string& movieName, double& adultTicketPrice,
              double& childTicketPrice, int& noOfAdultTicketSold,
              int& noOfChildTicketSold, double& percentageDonation) {

    cout << "Name of the movie: ";
    getline(cin, movieName);
    cout << endl;

    cout << "Adult ticket price: ";
    cin >> adultTicketPrice;
    cout << endl;

    cout << "Child ticket price: ";
    cin >> childTicketPrice;
    cout << endl;

    cout << "Number of adult tickets sold: ";
    cin >> noOfAdultTicketSold;
    cout << endl;

    cout << "Number of child tickets sold: ";
    cin >> noOfChildTicketSold;
    cout << endl;

    cout << "Gross percentage that you would like to donate: ";
    cin >> percentageDonation;
    cout << endl;

}